

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O3

int MRIStepGetNumLinSolvSetups(void *arkode_mem,long *nlinsetups)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem local_18;
  ARKodeMem local_10;
  
  iVar1 = mriStep_AccessStepMem(arkode_mem,"MRIStepGetNumLinSolvSetups",&local_10,&local_18);
  if (iVar1 == 0) {
    *nlinsetups = local_18->nsetups;
  }
  return iVar1;
}

Assistant:

int MRIStepGetNumLinSolvSetups(void *arkode_mem, long int *nlinsetups)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepGetNumLinSolvSetups",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* get value from step_mem */
  *nlinsetups = step_mem->nsetups;

  return(ARK_SUCCESS);
}